

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

round_direction
fmt::v6::internal::get_round_direction(uint64_t divisor,uint64_t remainder,uint64_t error)

{
  uint64_t error_local;
  uint64_t remainder_local;
  uint64_t divisor_local;
  undefined4 local_4;
  
  if ((divisor - remainder < remainder) || (divisor + remainder * -2 < error * 2)) {
    if ((remainder < error) || (remainder - error < divisor - (remainder - error))) {
      local_4 = unknown;
    }
    else {
      local_4 = up;
    }
  }
  else {
    local_4 = down;
  }
  return local_4;
}

Assistant:

inline round_direction get_round_direction(uint64_t divisor, uint64_t remainder,
                                           uint64_t error) {
  FMT_ASSERT(remainder < divisor, "");  // divisor - remainder won't overflow.
  FMT_ASSERT(error < divisor, "");      // divisor - error won't overflow.
  FMT_ASSERT(error < divisor - error, "");  // error * 2 won't overflow.
  // Round down if (remainder + error) * 2 <= divisor.
  if (remainder <= divisor - remainder && error * 2 <= divisor - remainder * 2)
    return down;
  // Round up if (remainder - error) * 2 >= divisor.
  if (remainder >= error &&
      remainder - error >= divisor - (remainder - error)) {
    return up;
  }
  return unknown;
}